

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void recordFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *psVar1;
  bool bVar2;
  u32 uVar3;
  uint uVar4;
  ulong uVar5;
  char *z;
  char *pcVar6;
  ulong v;
  int iVar7;
  u32 nVal;
  u32 local_44;
  sqlite3_context *local_40;
  sqlite3 *local_38;
  
  uVar3 = sqlite3VdbeSerialType(*argv,1,&local_44);
  v = (ulong)uVar3;
  iVar7 = 2;
  uVar5 = v;
  if (0x7f < uVar3) {
    do {
      iVar7 = iVar7 + 1;
      bVar2 = 0x3fff < uVar5;
      uVar5 = uVar5 >> 7;
    } while (bVar2);
  }
  local_38 = context->pOut->db;
  z = (char *)sqlite3DbMallocRawNN(local_38,(long)(int)(local_44 + iVar7));
  if (z == (char *)0x0) {
    sqlite3_result_error_nomem(context);
    return;
  }
  *z = (char)iVar7;
  local_40 = context;
  if (uVar3 < 0x80) {
    z[1] = (char)uVar3;
  }
  else {
    sqlite3PutVarint((uchar *)(z + 1),v);
  }
  psVar1 = *argv;
  if (uVar3 - 1 < 7) {
    uVar4 = (uint)""[v];
    pcVar6 = z + iVar7 + (""[v] - 1);
    uVar5 = (psVar1->u).i;
    do {
      *pcVar6 = (char)uVar5;
      pcVar6 = pcVar6 + -1;
      uVar4 = uVar4 - 1;
      uVar5 = uVar5 >> 8;
    } while (uVar4 != 0);
  }
  else if ((0xb < uVar3) && ((ulong)(uint)psVar1->n != 0)) {
    memcpy(z + iVar7,psVar1->z,(ulong)(uint)psVar1->n);
  }
  setResultStrOrError(local_40,z,local_44 + iVar7,'\0',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3DbFreeNN(local_38,z);
  return;
}

Assistant:

static void recordFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const int file_format = 1;
  u32 iSerial;                    /* Serial type */
  int nSerial;                    /* Bytes of space for iSerial as varint */
  u32 nVal;                       /* Bytes of space required for argv[0] */
  int nRet;
  sqlite3 *db;
  u8 *aRet;

  UNUSED_PARAMETER( argc );
  iSerial = sqlite3VdbeSerialType(argv[0], file_format, &nVal);
  nSerial = sqlite3VarintLen(iSerial);
  db = sqlite3_context_db_handle(context);

  nRet = 1 + nSerial + nVal;
  aRet = sqlite3DbMallocRawNN(db, nRet);
  if( aRet==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    aRet[0] = nSerial+1;
    putVarint32(&aRet[1], iSerial);
    sqlite3VdbeSerialPut(&aRet[1+nSerial], argv[0], iSerial);
    sqlite3_result_blob(context, aRet, nRet, SQLITE_TRANSIENT);
    sqlite3DbFreeNN(db, aRet);
  }
}